

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

void sq_settop(HSQUIRRELVM v,SQInteger newtop)

{
  long lVar1;
  
  lVar1 = v->_top - v->_stackbase;
  if (lVar1 - newtop != 0 && newtop <= lVar1) {
    SQVM::Pop(v,lVar1 - newtop);
    return;
  }
  for (; lVar1 < newtop; lVar1 = lVar1 + 1) {
    SQVM::PushNull(v);
  }
  return;
}

Assistant:

void sq_settop(HSQUIRRELVM v, SQInteger newtop)
{
    SQInteger top = sq_gettop(v);
    if(top > newtop)
        sq_pop(v, top - newtop);
    else
        while(top++ < newtop) sq_pushnull(v);
}